

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int CVodeSetJacTimesBS(void *cvode_mem,int which,CVLsJacTimesSetupFnBS jtsetupBS,
                      CVLsJacTimesVecFnBS jtimesBS)

{
  code *cvode_mem_00;
  CVLsJacTimesSetupFn jtsetup;
  sunrealtype in_RCX;
  sunrealtype in_RDX;
  int retval;
  CVLsJacTimesVecFn cvls_jtimes;
  CVLsJacTimesSetupFn cvls_jtsetup;
  CVLsMemB cvlsB_mem;
  void *cvodeB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  CVadjMem local_50;
  CVLsMemB local_48;
  CVLsMemB *in_stack_ffffffffffffffc0;
  int local_4;
  
  local_4 = cvLs_AccessLMemB(in_stack_ffffffffffffffa8,
                             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffff90,&local_50,(CVodeBMem *)0x13f0d4,
                             in_stack_ffffffffffffffc0);
  if (local_4 == 0) {
    local_50->ca_tstopCVodeF = in_RDX;
    local_50->ca_troot = in_RCX;
    local_48 = in_stack_ffffffffffffffc0[2];
    cvode_mem_00 = cvLsJacTimesSetupBSWrapper;
    if (in_RDX == 0.0) {
      cvode_mem_00 = (code *)0x0;
    }
    jtsetup = cvLsJacTimesVecBSWrapper;
    if (in_RCX == 0.0) {
      jtsetup = (CVLsJacTimesSetupFn)0x0;
    }
    local_4 = CVodeSetJacTimes(cvode_mem_00,jtsetup,
                               (CVLsJacTimesVecFn)(ulong)in_stack_ffffffffffffff98);
  }
  return local_4;
}

Assistant:

int CVodeSetJacTimesBS(void* cvode_mem, int which,
                       CVLsJacTimesSetupFnBS jtsetupBS,
                       CVLsJacTimesVecFnBS jtimesBS)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  CVLsMemB cvlsB_mem;
  CVLsJacTimesSetupFn cvls_jtsetup;
  CVLsJacTimesVecFn cvls_jtimes;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Set jacobian routines for the backward problem. */
  cvlsB_mem->jtsetupBS = jtsetupBS;
  cvlsB_mem->jtimesBS  = jtimesBS;

  /* Call the corresponding "set" routine for the backward problem */
  cvodeB_mem   = (void*)(cvB_mem->cv_mem);
  cvls_jtsetup = (jtsetupBS == NULL) ? NULL : cvLsJacTimesSetupBSWrapper;
  cvls_jtimes  = (jtimesBS == NULL) ? NULL : cvLsJacTimesVecBSWrapper;
  return (CVodeSetJacTimes(cvodeB_mem, cvls_jtsetup, cvls_jtimes));
}